

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::~op_queue
          (op_queue<asio::detail::reactor_op> *this)

{
  reactor_op *o;
  reactor_op *op;
  op_queue<asio::detail::reactor_op> *this_local;
  
  while (o = this->front_, o != (reactor_op *)0x0) {
    pop(this);
    op_queue_access::destroy<asio::detail::reactor_op>(o);
  }
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }